

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O3

bool __thiscall DataRefs::SetCfgValue(DataRefs *this,void *p,int val)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  WeatherCtrlTy WVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  
  piVar1 = &this->fdRefreshIntvl;
  iVar5 = this->fdRefreshIntvl;
  iVar6 = this->fdLongRefrIntvl;
  piVar2 = &this->fdLongRefrIntvl;
  uVar7 = *p;
  *(int *)p = val;
  if (piVar1 == (int *)p || piVar2 == (int *)p) {
    iVar11 = *piVar1;
    iVar10 = *piVar2;
    if (*piVar2 < iVar11) {
      *piVar2 = iVar11;
      iVar10 = iVar11;
    }
    if (this->fdBufPeriod < iVar10) {
      this->fdBufPeriod = iVar10;
    }
  }
  else {
    piVar3 = &this->fdBufPeriod;
    if (piVar3 == (int *)p) {
      iVar11 = *piVar1;
      iVar10 = *piVar3;
      if (*piVar3 < iVar11) {
        *piVar3 = iVar11;
        iVar10 = iVar11;
      }
      if (iVar10 < *piVar2) {
        *piVar2 = iVar10;
      }
    }
    else {
      piVar3 = &this->contrailAltMax_ft;
      piVar4 = &this->contrailAltMin_ft;
      if (piVar3 == (int *)p) {
        iVar11 = *piVar3 + -1000;
        if (iVar11 < *piVar4) {
          iVar10 = 0;
          if (0 < iVar11) {
            iVar10 = iVar11;
          }
          *piVar4 = iVar10;
        }
      }
      else if ((piVar4 == (int *)p) && (iVar11 = *piVar4 + 1000, *piVar3 < iVar11)) {
        iVar10 = 90000;
        if (iVar11 < 90000) {
          iVar10 = iVar11;
        }
        *piVar3 = iVar10;
      }
    }
  }
  if (((((((((uint)this->labelColor < 0x1000000) && (0xfffffed7 < this->maxNumAc - 0x12dU)) &&
          ((uint)this->volMaster < 0xc9)) &&
         ((0xffffff9f < this->fdStdDistance - 0x65U &&
          (iVar11 = *piVar1, 0xffffff54 < iVar11 - 0xb5U)))) &&
        (iVar10 = *piVar2, iVar10 < 0xb5 && iVar11 <= iVar10)) &&
       (((this->fdBufPeriod < 0xb5 && iVar10 <= this->fdBufPeriod &&
         (0xfffe7d46 < this->fdReduceHeight - 0x186a1U)) &&
        (((uint)this->fdSnapTaxiDist < 0x33 &&
         (((4 < this->netwTimeoutMax && ((uint)this->hideBelowAGL < 0xea61)) &&
          ((uint)this->hideNearbyGnd < 0x1f5)))))))) &&
      ((((uint)this->hideNearbyAir < 0x1389 &&
        (0xffffdcd6 < this->weatherMaxMETARheight_ft - 0x2711U)) &&
       ((0xffffff9f < this->weatherMaxMETARdist_nm - 0x65U &&
        ((((0xffff03ff < this->rtListenPort - 0x10000U &&
           (0xffff03ff < this->rtTrafficPort - 0x10000U)) &&
          ((0xffff03ff < this->rtWeatherPort - 0x10000U &&
           (((this->rtSTC < (STC_SIM_TIME_PLUS_BUFFER|STC_SIM_TIME_MANUALLY) &&
             ((uint)this->contrailAltMin_ft < 0x15f91)) && ((uint)this->contrailAltMax_ft < 0x15f91)
            ))))) &&
         ((0xfffffed7 < this->contrailLifeTime - 0x12dU &&
          (0xffff03ff < this->ffListenPort - 0x10000U)))))))))) &&
     ((0xffff03ff < this->ffSendPort - 0x10000U && ((uint)this->fscEnv < 2)))) {
    if (&this->labelMaxDist == (int *)p) {
      XPMPSetAircraftLabelDist((float)this->labelMaxDist,this->bLabelVisibilityCUtOff != 0);
    }
    else if ((piVar1 == (int *)p) && (this->fdCurrRefrIntvl == iVar5)) {
      this->fdCurrRefrIntvl = iVar11;
    }
    else if ((piVar2 == (int *)p) && (this->fdCurrRefrIntvl == iVar6)) {
      this->fdCurrRefrIntvl = iVar10;
    }
    else if (&this->volMaster == (int *)p) {
      if (this->volMaster == 0) {
        XPMPSoundEnable(false);
      }
      else {
        bVar9 = XPMPSoundIsEnabled();
        if ((!bVar9) && (0 < (int)this->pluginState)) {
          XPMPSoundEnable(true);
        }
        XPMPSoundSetMasterVolume((float)this->volMaster / 100.0);
      }
    }
    if (&this->weatherCtl == (WeatherCtrlTy *)p) {
      WVar8 = this->weatherCtl;
      if ((uint)(WVar8 + WC_METAR_XP) < 2) {
        WeatherReset();
      }
      else if (WVar8 == WC_METAR_XP) {
        WeatherSet(&this->lastWeatherMETAR,&this->lastWeatherStationId);
      }
    }
    LogCfgSetting(p,val);
    bVar9 = true;
  }
  else {
    *(undefined4 *)p = uVar7;
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool DataRefs::SetCfgValue (void* p, int val)
{
    // If fdSnapTaxiDist changes we might want to enable/disable airport reading
    const int oldRefreshInvtl       = fdRefreshIntvl;
    const int oldLongRefreshIntvl   = fdLongRefrIntvl;
    
    // we don't exactly know which parameter p points to...
    // ...we just set it, validate all of them, and reset in case validation fails
    int oldVal = *reinterpret_cast<int*>(p);
    *reinterpret_cast<int*>(p) = val;
    
    // Setting the refresh intervals or the buffering period
    // might require adapting the other values:
    // refresh intvl <= long refresh intvl <= buffering period
    if (p == &fdRefreshIntvl || p == &fdLongRefrIntvl) {
        if (fdRefreshIntvl > fdLongRefrIntvl)   // long refresh must be at least as long as normal refresh
            fdLongRefrIntvl = fdRefreshIntvl;
        if (fdLongRefrIntvl > fdBufPeriod)      // buf period must be at least as long as long refresh
            fdBufPeriod = fdLongRefrIntvl;
    }
    else if (p == &fdBufPeriod) {
        if (fdRefreshIntvl > fdBufPeriod)       // buf period cannot be smaller than refresh interval
            fdBufPeriod = fdRefreshIntvl;
        if (fdLongRefrIntvl > fdBufPeriod)      // reduce long refresh to buf period
            fdLongRefrIntvl = fdBufPeriod;
    }
    
    // Contrails: Setting the max value will lower the min value, too
    else if (p == &contrailAltMax_ft) {
        if (contrailAltMin_ft > contrailAltMax_ft - 1000)
            contrailAltMin_ft = std::max(0, contrailAltMax_ft - 1000);
    }
    else if (p == &contrailAltMin_ft) {
        if (contrailAltMax_ft < contrailAltMin_ft + 1000)
            contrailAltMax_ft = std::min(90000, contrailAltMin_ft + 1000);
    }
    
    // any configuration value invalid?
    if (labelColor      < 0                 || labelColor       > 0xFFFFFF ||
#ifdef DEBUG
        maxNumAc        < 1                 || maxNumAc         > MAX_NUM_AIRCRAFT   ||
#else
        maxNumAc        < 5                 || maxNumAc         > MAX_NUM_AIRCRAFT   ||
#endif
        volMaster       < 0                 || volMaster        > 200   ||
        fdStdDistance   < 5                 || fdStdDistance    > 100   ||
        fdRefreshIntvl  < 10                || fdRefreshIntvl   > 180   ||
        fdLongRefrIntvl < fdRefreshIntvl    || fdLongRefrIntvl  > 180   ||
        fdBufPeriod     < fdLongRefrIntvl   || fdBufPeriod      > 180   ||
        fdReduceHeight  < 1000              || fdReduceHeight   > 100000||
        fdSnapTaxiDist  < 0                 || fdSnapTaxiDist   > 50    ||
        netwTimeoutMax  < 5                 ||
        hideBelowAGL    < 0                 || hideBelowAGL     > MDL_ALT_MAX ||
        hideNearbyGnd   < 0                 || hideNearbyGnd    > 500   ||
        hideNearbyAir   < 0                 || hideNearbyAir    > 5000  ||
        weatherMaxMETARheight_ft < 1000     || weatherMaxMETARheight_ft > 10000 ||
        weatherMaxMETARdist_nm   <    5     || weatherMaxMETARdist_nm   >   100 ||
        rtListenPort    < 1024              || rtListenPort     > 65535 ||
        rtTrafficPort   < 1024              || rtTrafficPort    > 65535 ||
        rtWeatherPort   < 1024              || rtWeatherPort    > 65535 ||
        rtSTC           < STC_NO_CTRL       || rtSTC            > STC_SIM_TIME_PLUS_BUFFER ||
        contrailAltMin_ft < 0               || contrailAltMin_ft> 90000 ||
        contrailAltMax_ft < 0               || contrailAltMax_ft> 90000 ||
        contrailLifeTime < 5                || contrailLifeTime >   300 ||
        ffListenPort    < 1024              || ffListenPort     > 65535 ||
        ffSendPort      < 1024              || ffSendPort       > 65535 ||
        fscEnv          < 0                 || fscEnv           > 1
        )
    {
        // undo change
        *reinterpret_cast<int*>(p) = oldVal;
        return false;
    }